

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
::store_if_better(solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
                  *this,bit_array *x,int remaining,long i)

{
  double dVar1;
  
  if (remaining < (this->m_best).remaining_constraints) {
    bit_array_impl::operator=((bit_array_impl *)&this->m_best,&x->super_bit_array_impl);
    dVar1 = duration(this);
    (this->m_best).duration = dVar1;
    (this->m_best).loop = i;
    (this->m_best).remaining_constraints = remaining;
  }
  return;
}

Assistant:

void store_if_better(const bit_array& x, int remaining, long int i)
    {
        if (m_best.remaining_constraints > remaining) {
            m_best.x = x;
            m_best.duration = duration();
            m_best.loop = i;
            m_best.remaining_constraints = remaining;
        }
    }